

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O0

future<void> __thiscall
tf::Executor::_async<tf::DefaultTaskParams,mixed_executor_async(unsigned_long)::__0>
          (Executor *this,DefaultTaskParams *params,anon_class_48_6_3e6f9f6d_for__M_fn *f,
          Topology *tpg,Node *parent)

{
  byte this_00 [8];
  byte in_RDX [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t in_RSI;
  Node *in_RDI;
  future<void> *__uf;
  long *in_FS_OFFSET;
  future<void> fVar1;
  future<void> fu;
  packaged_task<void_()> p;
  packaged_task<void_()> *in_stack_fffffffffffffeb8;
  undefined8 this_01;
  undefined8 node;
  Executor *in_stack_fffffffffffffed0;
  Node *in_stack_fffffffffffffee0;
  Worker *in_stack_fffffffffffffee8;
  packaged_task<void_()> *in_stack_fffffffffffffef0;
  Node *this_02;
  in_place_type_t<tf::Node::Async> *args;
  anon_class_16_1_54a39810 *in_stack_ffffffffffffff20;
  undefined1 local_c9 [33];
  in_place_type_t<tf::Node::Async> local_a8 [16];
  undefined1 local_98 [8];
  undefined1 local_90 [16];
  U local_80;
  U local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  underlying_type *local_18;
  underlying_type *local_10;
  
  args = local_a8;
  this_02 = in_RDI;
  local_80.buff = in_RDX;
  std::packaged_task<void()>::packaged_task<mixed_executor_async(unsigned_long)::__0,void>
            (in_stack_fffffffffffffef0,
             (anon_class_48_6_3e6f9f6d_for__M_fn *)in_stack_fffffffffffffee8);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)in_stack_fffffffffffffee8);
  local_c9._1_4_ = 0;
  make_moc<std::packaged_task<void()>>(in_stack_fffffffffffffeb8);
  local_10 = &NSTATE::NONE;
  local_18 = &ESTATE::NONE;
  local_28 = local_90;
  local_30 = local_98;
  local_38 = local_c9 + 1;
  local_40 = local_c9;
  local_48 = &stack0xffffffffffffff20;
  this_00 = (byte  [8])operator_new(0xd8);
  __uf = (future<void> *)(long)*(int *)local_38;
  this_01 = local_40;
  node = local_48;
  tf::Node::
  Node<std::in_place_type_t<tf::Node::Async>,tf::Executor::_async<tf::DefaultTaskParams,mixed_executor_async(unsigned_long)::__0>(tf::DefaultTaskParams&&,mixed_executor_async(unsigned_long)::__0&&,tf::Topology*,tf::Node*)::_lambda()_1_>
            (this_02,local_80.buff._4_4_,local_80.buff._0_4_,(DefaultTaskParams *)this_00,
             (Topology *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_RSI,args,
             in_stack_ffffffffffffff20);
  local_68.buff = this_00;
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    _schedule(in_stack_fffffffffffffed0,(Node *)node);
  }
  else {
    _schedule((Executor *)this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  }
  _async<tf::DefaultTaskParams,mixed_executor_async(unsigned_long)::$_0>(tf::DefaultTaskParams&&,mixed_executor_async(unsigned_long)::$_0&&,tf::Topology*,tf::Node*)
  ::{lambda()#1}::~Node((anon_class_16_1_54a39810 *)0x129839);
  std::future<void>::future((future<void> *)this_01,__uf);
  std::future<void>::~future((future<void> *)0x129858);
  std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)in_stack_fffffffffffffed0);
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (future<void>)
         fVar1.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto Executor::_async(P&& params, F&& f, Topology* tpg, Node* parent) {
  
  // async task with runtime: [] (tf::Runtime&) -> void {}
  if constexpr (is_runtime_task_v<F>) {

    std::promise<void> p;
    auto fu{p.get_future()};
    
    _schedule_async_task(animate(
      NSTATE::NONE, ESTATE::ANCHORED, std::forward<P>(params), tpg, parent, 0, 
      std::in_place_type_t<Node::Async>{}, 
      [p=MoC{std::move(p)}, f=std::forward<F>(f)](Runtime& rt, bool reentered) mutable { 
        if(!reentered) {
          f(rt);
        }
        else {
          auto& eptr = rt._parent->_exception_ptr;
          eptr ? p.object.set_exception(eptr) : p.object.set_value();
        }
      }
    ));
    return fu;
  }
  // async task with closure: [] () -> auto { return ... }
  else if constexpr (std::is_invocable_v<F>){
    using R = std::invoke_result_t<F>;
    std::packaged_task<R()> p(std::forward<F>(f));
    auto fu{p.get_future()};
    _schedule_async_task(animate(
      NSTATE::NONE, ESTATE::NONE, std::forward<P>(params), tpg, parent, 0, 
      std::in_place_type_t<Node::Async>{}, 
      [p=make_moc(std::move(p))]() mutable { p.object(); }
    ));
    return fu;
  }
  else {
    static_assert(dependent_false_v<F>, 
      "invalid async target - must be one of the following types:\n\
      (1) [] (tf::Runtime&) -> void {}\n\
      (2) [] () -> auto { ... return ... }\n"
    );
  }
}